

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxx_message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cxx::MessageGenerator::GenerateSerializeWithCachedSizesToArray
          (MessageGenerator *this,Printer *printer)

{
  bool bVar1;
  MessageOptions *this_00;
  FileDescriptor *file;
  Printer *printer_local;
  MessageGenerator *this_local;
  
  this_00 = Descriptor::options(this->descriptor_);
  bVar1 = MessageOptions::message_set_wire_format(this_00);
  if (bVar1) {
    io::Printer::Print(printer,
                       "::google::protobuf::uint8* $classname$::SerializeWithCachedSizesToArray(\n    ::google::protobuf::uint8* target) const {\n  target =\n      _extensions_.SerializeMessageSetWithCachedSizesToArray(target);\n"
                       ,"classname",&this->classname_);
    file = Descriptor::file(this->descriptor_);
    bVar1 = HasUnknownFields(file);
    if (bVar1) {
      io::Printer::Print(printer,
                         "  target = ::google::protobuf::internal::WireFormat::\n             SerializeUnknownMessageSetItemsToArray(\n               unknown_fields(), target);\n"
                        );
    }
    io::Printer::Print(printer,"  return target;\n}\n");
  }
  else {
    io::Printer::Print(printer,
                       "::google::protobuf::uint8* $classname$::SerializeWithCachedSizesToArray(\n    ::google::protobuf::uint8* target) const {\n"
                       ,"classname",&this->classname_);
    io::Printer::Indent(printer);
    GenerateSerializeWithCachedSizesBody(this,printer,true);
    io::Printer::Outdent(printer);
    io::Printer::Print(printer,"  return target;\n}\n");
  }
  return;
}

Assistant:

void MessageGenerator::
GenerateSerializeWithCachedSizesToArray(io::Printer* printer) {
  if (descriptor_->options().message_set_wire_format()) {
    // Special-case MessageSet.
    printer->Print(
      "::google::protobuf::uint8* $classname$::SerializeWithCachedSizesToArray(\n"
      "    ::google::protobuf::uint8* target) const {\n"
      "  target =\n"
      "      _extensions_.SerializeMessageSetWithCachedSizesToArray(target);\n",
      "classname", classname_);
    if (HasUnknownFields(descriptor_->file())) {
      printer->Print(
        "  target = ::google::protobuf::internal::WireFormat::\n"
        "             SerializeUnknownMessageSetItemsToArray(\n"
        "               unknown_fields(), target);\n");
    }
    printer->Print(
      "  return target;\n"
      "}\n");
    return;
  }

  printer->Print(
    "::google::protobuf::uint8* $classname$::SerializeWithCachedSizesToArray(\n"
    "    ::google::protobuf::uint8* target) const {\n",
    "classname", classname_);
  printer->Indent();

  GenerateSerializeWithCachedSizesBody(printer, true);

  printer->Outdent();
  printer->Print(
    "  return target;\n"
    "}\n");
}